

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall simple_json::Stream::emit_json_key_value(Stream *this,string *key,float value)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char buf [64];
  char local_88 [64];
  char *local_48;
  size_t local_40;
  char local_38 [16];
  
  emit_json_key(this,key);
  cVar1 = this->current_locale_radix_character;
  sprintf(local_88,"%.32g",(double)value);
  if (local_88[0] != '\0' && cVar1 != '.') {
    pcVar2 = local_88;
    do {
      pcVar2 = pcVar2 + 1;
      if (local_88[0] == cVar1) {
        pcVar2[-1] = '.';
      }
      local_88[0] = *pcVar2;
    } while (local_88[0] != '\0');
  }
  pcVar2 = strchr(local_88,0x2e);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(local_88,0x65);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(local_88);
      (local_88 + sVar3)[0] = '.';
      (local_88 + sVar3)[1] = '0';
      local_88[sVar3 + 2] = '\0';
    }
  }
  local_48 = local_38;
  sVar3 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_88,local_88 + sVar3);
  spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void Stream::emit_json_key_value(const std::string &key, float value)
{
	emit_json_key(key);
	statement_inner(convert_to_string(value, current_locale_radix_character));
}